

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Own<const_kj::Executor,_std::nullptr_t> __thiscall kj::_::ExecutorImpl::addRef(ExecutorImpl *this)

{
  Executor *extraout_RDX;
  ExecutorImpl *in_RSI;
  Own<const_kj::Executor,_std::nullptr_t> OVar1;
  ExecutorImpl *this_local;
  
  this_local = this;
  atomicAddRef<kj::_::ExecutorImpl>((kj *)&stack0xffffffffffffffd8,in_RSI);
  Own<kj::Executor_const,decltype(nullptr)>::Own<kj::_::ExecutorImpl_const,void>
            ((Own<kj::Executor_const,decltype(nullptr)> *)this,
             (Own<const_kj::_::ExecutorImpl,_std::nullptr_t> *)&stack0xffffffffffffffd8);
  Own<const_kj::_::ExecutorImpl,_std::nullptr_t>::~Own
            ((Own<const_kj::_::ExecutorImpl,_std::nullptr_t> *)&stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<const Executor> addRef() const override {
    return kj::atomicAddRef(*this);
  }